

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Torsion.hpp
# Opt level: O2

string * __thiscall
OpenMD::Torsion::getName_abi_cxx11_(string *__return_storage_ptr__,Torsion *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name_);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getName() { return name_; }